

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# whisper.cpp
# Opt level: O1

void whisper_free_state(whisper_state *state)

{
  whisper_token *__ptr;
  whisper_pos *__ptr_00;
  int32_t *__ptr_01;
  whisper_seq_id **__ptr_02;
  int8_t *__ptr_03;
  whisper_seq_id *__ptr_04;
  pointer ppgVar1;
  whisper_seq_id **ppwVar2;
  ggml_backend **backend;
  pointer ppgVar3;
  
  if (state != (whisper_state *)0x0) {
    ggml_backend_buffer_free((state->kv_self).buffer);
    ggml_backend_buffer_free((state->kv_cross).buffer);
    ggml_backend_buffer_free((state->kv_pad).buffer);
    __ptr = (state->batch).token;
    __ptr_00 = (state->batch).pos;
    __ptr_01 = (state->batch).n_seq_id;
    __ptr_02 = (state->batch).seq_id;
    __ptr_03 = (state->batch).logits;
    if (__ptr != (whisper_token *)0x0) {
      free(__ptr);
    }
    if (__ptr_00 != (whisper_pos *)0x0) {
      free(__ptr_00);
    }
    if (__ptr_01 != (int32_t *)0x0) {
      free(__ptr_01);
    }
    if (__ptr_02 != (whisper_seq_id **)0x0) {
      __ptr_04 = *__ptr_02;
      ppwVar2 = __ptr_02;
      while (__ptr_04 != (whisper_seq_id *)0x0) {
        ppwVar2 = ppwVar2 + 1;
        free(__ptr_04);
        __ptr_04 = *ppwVar2;
      }
      free(__ptr_02);
    }
    if (__ptr_03 != (int8_t *)0x0) {
      free(__ptr_03);
    }
    ggml_backend_sched_free((state->sched_conv).sched);
    ggml_backend_sched_free((state->sched_encode).sched);
    ggml_backend_sched_free((state->sched_cross).sched);
    ggml_backend_sched_free((state->sched_decode).sched);
    ppgVar1 = (state->backends).super__Vector_base<ggml_backend_*,_std::allocator<ggml_backend_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    for (ppgVar3 = (state->backends).
                   super__Vector_base<ggml_backend_*,_std::allocator<ggml_backend_*>_>._M_impl.
                   super__Vector_impl_data._M_start; ppgVar3 != ppgVar1; ppgVar3 = ppgVar3 + 1) {
      ggml_backend_free(*ppgVar3);
    }
    ggml_free((state->aheads_masks).ctx);
    ggml_backend_buffer_free((state->aheads_masks).buffer);
    (state->aheads_masks).ctx = (ggml_context *)0x0;
    whisper_state::~whisper_state(state);
    operator_delete(state,0xa740);
    return;
  }
  return;
}

Assistant:

void whisper_free_state(struct whisper_state * state) {
    if (state) {
        whisper_kv_cache_free(state->kv_self);
        whisper_kv_cache_free(state->kv_cross);
        whisper_kv_cache_free(state->kv_pad);

#ifdef WHISPER_USE_COREML
        if (state->ctx_coreml != nullptr) {
            whisper_coreml_free(state->ctx_coreml);
            state->ctx_coreml = nullptr;
        }
#endif

#ifdef WHISPER_USE_OPENVINO
        if (state->ctx_openvino != nullptr) {
            whisper_openvino_free(state->ctx_openvino);
            state->ctx_openvino = nullptr;
        }
#endif

        whisper_batch_free(state->batch);

        ggml_backend_sched_free(state->sched_conv.sched);
        ggml_backend_sched_free(state->sched_encode.sched);
        ggml_backend_sched_free(state->sched_cross.sched);
        ggml_backend_sched_free(state->sched_decode.sched);

        for (auto & backend : state->backends) {
            ggml_backend_free(backend);
        }

        // [EXPERIMENTAL] Token-level timestamps with DTW
        aheads_masks_free(state->aheads_masks);

        delete state;
    }
}